

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_command_line.cpp
# Opt level: O0

void __thiscall
ClCommandLine_RequiredStringPositional_Test::~ClCommandLine_RequiredStringPositional_Test
          (ClCommandLine_RequiredStringPositional_Test *this)

{
  ClCommandLine_RequiredStringPositional_Test *this_local;
  
  ~ClCommandLine_RequiredStringPositional_Test(this);
  operator_delete(this,0x28);
  return;
}

Assistant:

TEST_F (ClCommandLine, RequiredStringPositional) {
    opt<std::string> option ("arg", positional, required);

    this->add ("progname");

    string_stream output;
    string_stream errors;
    bool const res = this->parse_command_line_options (output, errors);
    EXPECT_FALSE (res);

    EXPECT_THAT (errors.str (),
                 testing::HasSubstr (PSTORE_NATIVE_TEXT ("a positional argument was missing")));
    EXPECT_EQ (output.str ().length (), 0U);

    EXPECT_EQ (option.get (), "");
}